

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme-test.cc
# Opt level: O0

function<void_()> * scope_example2::f(void)

{
  Logger *in_RDI;
  MyLogger capture_messages;
  Logger *__f;
  Logger *in_stack_ffffffffffffff80;
  
  __f = in_RDI;
  Logger::Logger(in_stack_ffffffffffffff80);
  std::function<void()>::function<scope_example2::f()::__0,void>
            ((function<void_()> *)in_stack_ffffffffffffff80,(anon_class_1_0_00000001 *)__f);
  Logger::~Logger(in_RDI);
  return (function<void_()> *)__f;
}

Assistant:

std::function<void()> f() {
  MyLogger capture_messages;
  return [] { MyLogger::Log("f was called"); };
}